

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_request.c
# Opt level: O1

ngx_int_t ngx_http_validate_host(ngx_str_t *host,ngx_pool_t *pool,ngx_uint_t alloc)

{
  byte bVar1;
  u_char *src;
  bool bVar2;
  u_char *dst;
  ngx_int_t nVar3;
  size_t sVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  bool bVar9;
  
  sVar4 = host->len;
  src = host->data;
  sVar8 = sVar4;
  if (sVar4 == 0) {
    bVar2 = true;
  }
  else {
    iVar5 = 0;
    sVar7 = 0;
    bVar2 = false;
    sVar6 = sVar4;
    do {
      bVar1 = src[sVar7];
      if (bVar1 < 0x3a) {
        if (bVar1 == 0x2e) {
          bVar9 = sVar7 - 1 == sVar6;
          sVar6 = sVar7;
          if (bVar9) {
            return -5;
          }
        }
        else {
          if (bVar1 == 0) {
            return -5;
          }
          if (bVar1 == 0x2f) {
            return -5;
          }
LAB_00143078:
          if ((byte)(bVar1 + 0xbf) < 0x1a) {
            bVar2 = true;
          }
        }
      }
      else {
        if (bVar1 == 0x3a) {
          bVar9 = iVar5 == 0;
          if (bVar9) {
            sVar8 = sVar7;
          }
        }
        else {
          if (bVar1 == 0x5b) {
            if (sVar7 == 0) {
              iVar5 = 1;
            }
            goto LAB_00143098;
          }
          if (bVar1 != 0x5d) goto LAB_00143078;
          bVar9 = iVar5 == 1;
          if (bVar9) {
            sVar8 = sVar7 + 1;
          }
        }
        if (bVar9) {
          iVar5 = 2;
        }
      }
LAB_00143098:
      sVar7 = sVar7 + 1;
    } while (sVar4 != sVar7);
    bVar2 = !bVar2;
    sVar4 = sVar6;
  }
  if (sVar4 == sVar8 - 1) {
    sVar8 = sVar8 - 1;
  }
  if (sVar8 == 0) {
    nVar3 = -5;
  }
  else {
    if (!bVar2) {
      dst = (u_char *)ngx_pnalloc(pool,sVar8);
      host->data = dst;
      if (dst == (u_char *)0x0) {
        return -1;
      }
      ngx_strlow(dst,src,sVar8);
    }
    host->len = sVar8;
    nVar3 = 0;
  }
  return nVar3;
}

Assistant:

static ngx_int_t
ngx_http_validate_host(ngx_str_t *host, ngx_pool_t *pool, ngx_uint_t alloc)
{
    u_char  *h, ch;
    size_t   i, dot_pos, host_len;

    enum {
        sw_usual = 0,
        sw_literal,
        sw_rest
    } state;

    dot_pos = host->len;
    host_len = host->len;

    h = host->data;

    state = sw_usual;

    for (i = 0; i < host->len; i++) {
        ch = h[i];

        switch (ch) {

        case '.':
            if (dot_pos == i - 1) {
                return NGX_DECLINED;
            }
            dot_pos = i;
            break;

        case ':':
            if (state == sw_usual) {
                host_len = i;
                state = sw_rest;
            }
            break;

        case '[':
            if (i == 0) {
                state = sw_literal;
            }
            break;

        case ']':
            if (state == sw_literal) {
                host_len = i + 1;
                state = sw_rest;
            }
            break;

        case '\0':
            return NGX_DECLINED;

        default:

            if (ngx_path_separator(ch)) {
                return NGX_DECLINED;
            }

            if (ch >= 'A' && ch <= 'Z') {
                alloc = 1;
            }

            break;
        }
    }

    if (dot_pos == host_len - 1) {
        host_len--;
    }

    if (host_len == 0) {
        return NGX_DECLINED;
    }

    if (alloc) {
        host->data = ngx_pnalloc(pool, host_len);
        if (host->data == NULL) {
            return NGX_ERROR;
        }

        ngx_strlow(host->data, h, host_len);
    }

    host->len = host_len;

    return NGX_OK;
}